

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::TypedConnection<tinyusdz::Token>::set(TypedConnection<tinyusdz::Token> *this,Path *p)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer this_00;
  
  pPVar1 = (this->_targetPaths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->_targetPaths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      Path::~Path(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pPVar2);
    (this->_targetPaths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
    .super__Vector_impl_data._M_finish = pPVar1;
  }
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back(&this->_targetPaths,p);
  this->_authored = true;
  return;
}

Assistant:

void set(const Path &p) {
    _targetPaths.clear();
    _targetPaths.push_back(p);
    _authored = true;
  }